

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void __thiscall duckdb::roaring::ContainerCompressionState::Reset(ContainerCompressionState *this)

{
  this->length = 0;
  this->appended_count = 0;
  this->null_count = 0;
  this->run_idx = 0;
  this->array_idx[0] = 0;
  this->array_idx[1] = 0;
  this->finalized = false;
  this->last_is_null = false;
  this->arrays[1] = this->base_arrays[1];
  this->arrays[0] = this->base_arrays[0];
  this->runs = this->base_runs;
  this->compressed_arrays[1] = this->base_compressed_arrays[1];
  this->compressed_arrays[0] = this->base_compressed_arrays[0];
  this->compressed_runs = this->base_compressed_runs;
  this->array_counts[1] = this->base_array_counts[1];
  this->array_counts[0] = this->base_array_counts[0];
  this->run_counts = this->base_run_counts;
  this->base_array_counts[0] = (uint8_t  [8])0x0;
  this->base_array_counts[1] = (uint8_t  [8])0x0;
  this->base_run_counts[0] = '\0';
  this->base_run_counts[1] = '\0';
  this->base_run_counts[2] = '\0';
  this->base_run_counts[3] = '\0';
  this->base_run_counts[4] = '\0';
  this->base_run_counts[5] = '\0';
  this->base_run_counts[6] = '\0';
  this->base_run_counts[7] = '\0';
  this->uncompressed = (validity_t *)0x0;
  return;
}

Assistant:

void ContainerCompressionState::Reset() {
	length = 0;

	appended_count = 0;
	null_count = 0;
	run_idx = 0;
	array_idx[NON_NULLS] = 0;
	array_idx[NULLS] = 0;
	finalized = false;
	last_is_null = false;

	// Reset the arrays + runs
	arrays[NULLS] = base_arrays[NULLS];
	arrays[NON_NULLS] = base_arrays[NON_NULLS];
	runs = base_runs;

	compressed_arrays[NULLS] = base_compressed_arrays[NULLS];
	compressed_arrays[NON_NULLS] = base_compressed_arrays[NON_NULLS];
	compressed_runs = base_compressed_runs;

	array_counts[NULLS] = base_array_counts[NULLS];
	array_counts[NON_NULLS] = base_array_counts[NON_NULLS];
	run_counts = base_run_counts;

	memset(array_counts[NULLS], 0, sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT);
	memset(array_counts[NON_NULLS], 0, sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT);
	memset(run_counts, 0, sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT);
	uncompressed = nullptr;
}